

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O2

real fasttext::distL2(real *x,real *y,int32_t d)

{
  ulong uVar1;
  ulong uVar2;
  real rVar3;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)d;
  if (d < 1) {
    uVar2 = uVar1;
  }
  rVar3 = 0.0;
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    rVar3 = rVar3 + (x[uVar1] - y[uVar1]) * (x[uVar1] - y[uVar1]);
  }
  return rVar3;
}

Assistant:

real distL2(const real* x, const real* y, int32_t d) {
  real dist = 0;
  for (auto i = 0; i < d; i++) {
    auto tmp = x[i] - y[i];
    dist += tmp * tmp;
  }
  return dist;
}